

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nnls.h
# Opt level: O1

Index __thiscall
Eigen::NNLS<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::_argmax_Z
          (NNLS<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *this,RowVectorType *v)

{
  float fVar1;
  long lVar2;
  long *plVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  float *pfVar7;
  long lVar8;
  char *__function;
  long lVar9;
  float fVar10;
  
  lVar8 = this->_Np;
  if ((lVar8 < 0) ||
     (lVar2 = (this->_P).m_indices.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows, lVar2 <= lVar8)) {
LAB_00175684:
    __function = 
    "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<long, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<long, -1, 1>, Level = 0]"
    ;
  }
  else {
    plVar3 = (this->_P).m_indices.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    lVar4 = plVar3[lVar8];
    if ((-1 < lVar4) &&
       (lVar5 = (v->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.m_rows,
       lVar4 < lVar5)) {
      lVar6 = (this->_A).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols;
      lVar9 = lVar8 + 1;
      if (lVar9 < lVar6) {
        pfVar7 = (v->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.m_data
        ;
        fVar10 = pfVar7[lVar4];
        do {
          if ((lVar9 + -1 < -1) || (lVar2 <= lVar9)) goto LAB_00175684;
          lVar4 = plVar3[lVar9];
          if ((lVar4 < 0) || (lVar5 <= lVar4)) goto LAB_0017569b;
          fVar1 = pfVar7[lVar4];
          lVar4 = lVar9;
          if (fVar1 <= fVar10) {
            fVar1 = fVar10;
            lVar4 = lVar8;
          }
          lVar8 = lVar4;
          fVar10 = fVar1;
          lVar9 = lVar9 + 1;
        } while (lVar6 != lVar9);
      }
      return lVar8;
    }
LAB_0017569b:
    __function = 
    "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<float, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<float, -1, 1>, Level = 0]"
    ;
  }
  __assert_fail("index >= 0 && index < size()",
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/DenseCoeffsBase.h"
                ,0xb5,__function);
}

Assistant:

Index _argmax_Z(const RowVectorType &v) {
    const IndicesType &idxs = _P.indices();
    Index m_idx = _Np; Scalar m = v(idxs(m_idx));
    for (Index i=(_Np+1); i<_A.cols(); i++) {
      Index idx = idxs(i);
      if (m < v(idx)) { m = v(idx); m_idx = i; }
    }
    return m_idx;
  }